

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberAccess.h
# Opt level: O0

ptr<Value> __thiscall MemberAccess::evaluate(MemberAccess *this,Environment *env)

{
  bool bVar1;
  ThrowPacket *pTVar2;
  element_type *peVar3;
  element_type *ident;
  Identifier *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ptr<Value> pVar4;
  allocator<char> local_e1;
  string local_e0;
  ptr<Value> local_c0;
  undefined1 local_a9;
  undefined1 local_a8 [8];
  ptr<Object> object;
  ptr<Value> currValue;
  allocator<char> local_71;
  string local_70;
  ptr<Value> local_50;
  undefined1 local_40 [8];
  ptr<Symbol> symbolRight;
  ptr<Symbol> symbolLeft;
  Environment *env_local;
  MemberAccess *this_local;
  ptr<Value> *value;
  
  std::dynamic_pointer_cast<Symbol,Expression>
            ((shared_ptr<Expression> *)
             &symbolRight.super___shared_ptr<Symbol,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::dynamic_pointer_cast<Symbol,Expression>((shared_ptr<Expression> *)local_40);
  bVar1 = std::__shared_ptr::operator_cast_to_bool
                    ((__shared_ptr *)
                     &symbolRight.super___shared_ptr<Symbol,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                    );
  if ((bVar1) && (bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_40), bVar1)
     ) {
    std::__shared_ptr_access<Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               &symbolRight.super___shared_ptr<Symbol,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    Environment::getValue
              ((Environment *)
               &object.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount,in_RDX);
    peVar3 = std::__shared_ptr_access<Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Value,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &object.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    (*(peVar3->super_Member)._vptr_Member[6])(local_a8);
    local_a9 = 0;
    ident = std::__shared_ptr_access<Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<Object,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       local_a8);
    std::__shared_ptr_access<Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)local_40);
    Object::getAttribute((Object *)this,(Identifier *)ident);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)this);
    if (!bVar1) {
      pTVar2 = (ThrowPacket *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e0,"Member not defined",&local_e1);
      ExceptionObjects::undefined((ExceptionObjects *)&local_c0,&local_e0);
      ThrowPacket::ThrowPacket(pTVar2,&local_c0);
      __cxa_throw(pTVar2,&ThrowPacket::typeinfo,ThrowPacket::~ThrowPacket);
    }
    local_a9 = 1;
    std::shared_ptr<Object>::~shared_ptr((shared_ptr<Object> *)local_a8);
    std::shared_ptr<Value>::~shared_ptr
              ((shared_ptr<Value> *)
               &object.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::shared_ptr<Symbol>::~shared_ptr((shared_ptr<Symbol> *)local_40);
    std::shared_ptr<Symbol>::~shared_ptr
              ((shared_ptr<Symbol> *)
               &symbolRight.super___shared_ptr<Symbol,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    pVar4.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    pVar4.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
    return (ptr<Value>)pVar4.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>;
  }
  pTVar2 = (ThrowPacket *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"The identifier is not a symbol",&local_71);
  ExceptionObjects::undefined((ExceptionObjects *)&local_50,&local_70);
  ThrowPacket::ThrowPacket(pTVar2,&local_50);
  __cxa_throw(pTVar2,&ThrowPacket::typeinfo,ThrowPacket::~ThrowPacket);
}

Assistant:

ptr<Value> evaluate(Environment *env) override {
        ptr<Symbol> symbolLeft = std::dynamic_pointer_cast<Symbol>(leftExpression);
        ptr<Symbol> symbolRight = std::dynamic_pointer_cast<Symbol>(rightExpression);

        if(!symbolLeft || !symbolRight)
            throw ThrowPacket(ExceptionObjects::undefined("The identifier is not a symbol"));

        ptr<Value> currValue = env -> getValue(symbolLeft -> name);
        ptr<Object> object = currValue -> asObject();
        ptr<Value> value = object -> getAttribute(symbolRight -> name);

        if(!value)
            throw ThrowPacket(ExceptionObjects::undefined("Member not defined"));

        return value;
    }